

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall
BufferTest_AppendAllocatesEnoughStorage_Test::~BufferTest_AppendAllocatesEnoughStorage_Test
          (BufferTest_AppendAllocatesEnoughStorage_Test *this)

{
  void *in_RDI;
  
  ~BufferTest_AppendAllocatesEnoughStorage_Test
            ((BufferTest_AppendAllocatesEnoughStorage_Test *)0x12c488);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(BufferTest, AppendAllocatesEnoughStorage) {
  char data[19];
  mock_buffer<char> buffer(data, 10);
  const char *test = "abcdefgh";
  buffer.resize(10);
  EXPECT_CALL(buffer, do_grow(19));
  buffer.append(test, test + 9);
}